

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<cbtBroadphasePair>::quickSortInternal<cbtBroadphasePairSortPredicate>
          (cbtAlignedObjectArray<cbtBroadphasePair> *this,
          cbtBroadphasePairSortPredicate *CompareFunc,int lo,int hi)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtBroadphasePair *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int local_80;
  cbtBroadphasePair local_58;
  
  pcVar3 = this->m_data;
  iVar14 = (hi + lo) / 2;
  local_58.m_pProxy0 = pcVar3[iVar14].m_pProxy0;
  local_58.m_pProxy1 = pcVar3[iVar14].m_pProxy1;
  local_58.m_algorithm = pcVar3[iVar14].m_algorithm;
  local_58.field_3 = pcVar3[iVar14].field_3;
  iVar14 = lo;
  local_80 = hi;
  do {
    lVar16 = (long)iVar14 + -1;
    lVar18 = (long)iVar14 << 5;
    iVar12 = iVar14;
    do {
      iVar14 = iVar12;
      lVar15 = lVar18;
      bVar13 = cbtBroadphasePairSortPredicate::operator()
                         (CompareFunc,(cbtBroadphasePair *)((long)&this->m_data->m_pProxy0 + lVar15)
                          ,&local_58);
      lVar16 = lVar16 + 1;
      lVar18 = lVar15 + 0x20;
      iVar12 = iVar14 + 1;
    } while (bVar13);
    lVar18 = (long)local_80 + 1;
    lVar11 = (long)local_80 << 5;
    iVar12 = local_80;
    do {
      local_80 = iVar12;
      lVar17 = lVar11;
      bVar13 = cbtBroadphasePairSortPredicate::operator()
                         (CompareFunc,&local_58,
                          (cbtBroadphasePair *)((long)&this->m_data->m_pProxy0 + lVar17));
      lVar18 = lVar18 + -1;
      lVar11 = lVar17 + -0x20;
      iVar12 = local_80 + -1;
    } while (bVar13);
    if (lVar16 <= lVar18) {
      pcVar3 = this->m_data;
      puVar1 = (undefined8 *)((long)&pcVar3->m_pProxy0 + lVar17);
      uVar8 = puVar1[1];
      uVar9 = puVar1[2];
      uVar10 = puVar1[3];
      puVar2 = (undefined8 *)((long)&pcVar3->m_pProxy0 + lVar15);
      uVar4 = *puVar2;
      uVar5 = puVar2[1];
      uVar6 = puVar2[2];
      uVar7 = puVar2[3];
      puVar2 = (undefined8 *)((long)&pcVar3->m_pProxy0 + lVar15);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      puVar2[2] = uVar9;
      puVar2[3] = uVar10;
      puVar1 = (undefined8 *)((long)&this->m_data->m_pProxy0 + lVar17);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      puVar1[2] = uVar6;
      puVar1[3] = uVar7;
      iVar14 = iVar14 + 1;
      local_80 = local_80 + -1;
    }
  } while (iVar14 <= local_80);
  if (lo < local_80) {
    quickSortInternal<cbtBroadphasePairSortPredicate>(this,CompareFunc,lo,local_80);
  }
  if (iVar14 < hi) {
    quickSortInternal<cbtBroadphasePairSortPredicate>(this,CompareFunc,iVar14,hi);
  }
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc, int lo, int hi)
	{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
		int i = lo, j = hi;
		T x = m_data[(lo + hi) / 2];

		//  partition
		do
		{
			while (CompareFunc(m_data[i], x))
				i++;
			while (CompareFunc(x, m_data[j]))
				j--;
			if (i <= j)
			{
				swap(i, j);
				i++;
				j--;
			}
		} while (i <= j);

		//  recursion
		if (lo < j)
			quickSortInternal(CompareFunc, lo, j);
		if (i < hi)
			quickSortInternal(CompareFunc, i, hi);
	}